

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O3

BSDFSample * __thiscall
pbrt::LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Sample_f
          (BSDFSample *__return_storage_ptr__,
          LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *this,Vector3f wo,
          Float uc,Point2f *u,TransportMode mode,BxDFReflTransFlags sampleFlags)

{
  long lVar1;
  float *pfVar2;
  Float FVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  bool bVar14;
  int i;
  uint uVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  IdealDiffuseBxDF *this_00;
  byte bVar19;
  ulong uVar20;
  uint uVar21;
  LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *this_01;
  ulong uVar22;
  uint64_t oldstate;
  long in_FS_OFFSET;
  bool bVar23;
  undefined1 auVar24 [16];
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [64];
  undefined1 extraout_var [60];
  undefined1 auVar34 [56];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [64];
  undefined1 auVar40 [60];
  undefined1 auVar41 [64];
  undefined1 in_XMM6 [16];
  Vector3f wo_00;
  Vector3f VVar42;
  Vector3f wo_01;
  Vector3f wo_02;
  SampledSpectrum f;
  BSDFSample bs;
  float local_128 [6];
  TransportMode local_110;
  float local_10c;
  undefined1 local_108 [16];
  Tuple2<pbrt::Point2,_float> local_f8;
  Float local_f0;
  float local_ec;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  IdealDiffuseBxDF *local_c0;
  BSDFSample local_b8;
  undefined1 local_88 [16];
  BSDFSample local_78;
  undefined1 local_48 [16];
  undefined1 auVar39 [64];
  
  fVar26 = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar38._8_56_ = wo._8_56_;
  auVar38._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_88 = auVar38._0_16_;
  if (sampleFlags != All) {
    LogFatal<char_const(&)[39]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/bxdfs.h"
               ,0x3a3,"Check failed: %s",(char (*) [39])"sampleFlags == BxDFReflTransFlags::All");
  }
  bVar23 = (this->config).twoSided != '\0';
  bVar14 = fVar26 < -fVar26;
  if (bVar14 && bVar23) {
    local_88._0_8_ = auVar38._0_8_ ^ 0x8000000080000000;
    local_88._8_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.z ^ 0x80000000;
    local_88._12_4_ = wo._12_4_ ^ 0x80000000;
  }
  local_e8._0_4_ = uc;
  local_48._4_12_ = wo._12_12_;
  local_48._0_4_ =
       (uint)(bVar14 && bVar23) * (int)-fVar26 + (uint)(!bVar14 || !bVar23) * (int)fVar26;
  VVar42.super_Tuple3<pbrt::Vector3,_float>._0_8_ = local_88._0_8_;
  if ((float)local_48._0_4_ <= 0.0) {
    wo_00.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_48._0_4_;
    wo_00.super_Tuple3<pbrt::Vector3,_float>.x =
         (float)(int)VVar42.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    wo_00.super_Tuple3<pbrt::Vector3,_float>.y =
         (float)(int)((ulong)VVar42.super_Tuple3<pbrt::Vector3,_float>._0_8_ >> 0x20);
    IdealDiffuseBxDF::Sample_f(&local_b8,&this->bottom,wo_00,uc,u,mode,All);
  }
  else {
    VVar42.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_48._0_4_;
    DielectricInterfaceBxDF::Sample_f(&local_b8,&this->top,VVar42,uc,u,mode,All);
  }
  if (0.0 < local_b8.pdf) {
    if ((local_b8.flags & Reflection) != Unset) {
      if (bVar14 && bVar23) {
        auVar24._0_8_ = local_b8.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
        auVar24._8_4_ = 0x80000000;
        auVar24._12_4_ = 0x80000000;
        local_b8.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar24);
        local_b8.wi.super_Tuple3<pbrt::Vector3,_float>.z =
             -local_b8.wi.super_Tuple3<pbrt::Vector3,_float>.z;
      }
      __return_storage_ptr__->flags = local_b8.flags;
      *(ulong *)(__return_storage_ptr__->f).values.values =
           CONCAT44(local_b8.f.values.values[1],local_b8.f.values.values[0]);
      *(ulong *)((__return_storage_ptr__->f).values.values + 2) =
           CONCAT44(local_b8.f.values.values[3],local_b8.f.values.values[2]);
      (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.x =
           local_b8.wi.super_Tuple3<pbrt::Vector3,_float>.x;
      (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.y =
           local_b8.wi.super_Tuple3<pbrt::Vector3,_float>.y;
      *(ulong *)&(__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.z =
           CONCAT44(local_b8.pdf,local_b8.wi.super_Tuple3<pbrt::Vector3,_float>.z);
      return __return_storage_ptr__;
    }
    local_108._4_4_ = local_b8.wi.super_Tuple3<pbrt::Vector3,_float>.z;
    local_108._0_4_ = local_b8.wi.super_Tuple3<pbrt::Vector3,_float>.z;
    local_108._8_4_ = local_b8.wi.super_Tuple3<pbrt::Vector3,_float>.z;
    local_108._12_4_ = local_b8.wi.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar38 = ZEXT864((ulong)local_b8.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_);
    auVar31._8_4_ = 0x7fffffff;
    auVar31._0_8_ = 0x7fffffff7fffffff;
    auVar31._12_4_ = 0x7fffffff;
    auVar24 = vandps_avx512vl(local_108,auVar31);
    local_128[0] = auVar24._0_4_ * local_b8.f.values.values[0];
    local_128[1] = auVar24._4_4_ * local_b8.f.values.values[1];
    local_128[2] = auVar24._8_4_ * local_b8.f.values.values[2];
    local_128[3] = auVar24._12_4_ * local_b8.f.values.values[3];
    if ((this->config).maxDepth != '\0') {
      uVar21 = 0;
      uVar20 = (long)u->super_Tuple2<pbrt::Point2,_float> * -0x395b586ca42e166b;
      local_f0 = this->g;
      uVar22 = ((ulong)(local_88._0_8_ * -0x395b586ca42e166b) >> 0x2f ^
               local_88._0_8_ * -0x395b586ca42e166b) * -0x395b586ca42e166b;
      uVar22 = (CONCAT44((int)(uVar22 >> 0x20),local_48._0_4_) ^
               (uVar22 ^ 0x4fb7dae84dd6f2fc) * -0x395b586ca42e166b) * -0x395b586ca42e166b;
      uVar22 = (uVar22 >> 0x2f ^ uVar22) * -0x395b586ca42e166b;
      uVar22 = (*(uint *)(Options + 4) & 0xffffff ^ uVar22 ^ 0x1a929e4d6f47a654 ^
               (uVar22 >> 0x2f | (ulong)(*(uint *)(Options + 4) & 0xff000000))) *
               -0x395b586ca42e166b;
      uVar22 = (uVar22 >> 0x2f ^ uVar22) * -0x395b586ca42e166b;
      lVar1 = (uVar22 >> 0x2f ^ uVar22) * 2 + 1;
      uVar20 = ((uVar20 >> 0x2f ^ uVar20) * -0x395b586ca42e166b ^ 0x35253c9ade8f4ca8) *
               -0x395b586ca42e166b;
      auVar41 = ZEXT1664((undefined1  [16])0x0);
      uVar20 = (uVar20 >> 0x2f ^ uVar20) * -0x395b586ca42e166b;
      uVar6 = vcmpss_avx512f((undefined1  [16])0x0,local_48,1);
      auVar33 = ZEXT464((uint)((byte)uVar6 & 1) * (int)this->thickness);
      uVar20 = (local_e8._0_4_ & 0xffffff ^ uVar20 ^ 0x1a929e4d6f47a654 ^
               ((ulong)(local_e8._0_4_ & 0xff000000) | uVar20 >> 0x2f)) * -0x395b586ca42e166b;
      uVar20 = (uVar20 >> 0x2f ^ uVar20) * -0x395b586ca42e166b;
      local_c0 = &this->bottom;
      uVar20 = (uVar20 >> 0x2f ^ uVar20) + lVar1;
      local_110 = mode;
      do {
        fVar26 = 1.0;
        local_e8 = auVar33._0_16_;
        auVar33 = ZEXT464((uint)local_128[0]);
        local_88 = auVar38._0_16_;
        lVar17 = 1;
        do {
          pfVar2 = local_128 + lVar17;
          lVar17 = lVar17 + 1;
          auVar24 = vmaxss_avx(ZEXT416((uint)*pfVar2),auVar33._0_16_);
          auVar33 = ZEXT1664(auVar24);
        } while (lVar17 != 4);
        uVar22 = uVar20 * 0x5851f42d4c957f2d + lVar1;
        if ((3 < uVar21) && (fVar25 = auVar24._0_4_ / local_b8.pdf, fVar25 < 0.25)) {
          uVar15 = (uint)(uVar22 >> 0x2d) ^ (uint)(uVar22 >> 0x1b);
          bVar19 = (byte)(uVar22 >> 0x3b);
          auVar24 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar25)),auVar41._0_16_);
          auVar31 = vcvtusi2ss_avx512f(in_XMM6,uVar15 >> bVar19 | uVar15 << 0x20 - bVar19);
          auVar31 = vminss_avx(ZEXT416((uint)(auVar31._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
          if (auVar31._0_4_ < auVar24._0_4_) break;
          local_b8.pdf = local_b8.pdf * (1.0 - auVar24._0_4_);
          uVar22 = uVar22 * 0x5851f42d4c957f2d + lVar1;
        }
        if (((float)local_108._0_4_ == 0.0) && (!NAN((float)local_108._0_4_))) break;
        fVar25 = (this->albedo).values.values[0];
        local_10c = local_b8.pdf;
        if ((fVar25 != 0.0) || (NAN(fVar25))) {
LAB_0037bfb2:
          uVar15 = (uint)(uVar22 >> 0x2d) ^ (uint)(uVar22 >> 0x1b);
          bVar19 = (byte)(uVar22 >> 0x3b);
          auVar24 = vcvtusi2ss_avx512f(in_XMM6,uVar15 >> bVar19 | uVar15 << 0x20 - bVar19);
          auVar24 = vminss_avx(ZEXT416((uint)(auVar24._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
          auVar33._0_4_ = logf(1.0 - auVar24._0_4_);
          auVar33._4_60_ = extraout_var;
          local_d8 = auVar33._0_16_;
          if ((LayeredBxDF<pbrt::DielectricInterfaceBxDF,pbrt::IdealDiffuseBxDF>::
               Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
               ::reg == '\0') &&
             (iVar16 = __cxa_guard_acquire(&LayeredBxDF<pbrt::DielectricInterfaceBxDF,pbrt::IdealDiffuseBxDF>
                                            ::
                                            Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                            ::reg), iVar16 != 0)) {
            StatRegisterer::StatRegisterer
                      ((StatRegisterer *)
                       &LayeredBxDF<pbrt::DielectricInterfaceBxDF,pbrt::IdealDiffuseBxDF>::
                        Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                        ::reg,const::{lambda(pbrt::StatsAccumulator&)#1}::StatsAccumulator__,
                       (PixelAccumFunc)0x0);
            __cxa_guard_release(&LayeredBxDF<pbrt::DielectricInterfaceBxDF,pbrt::IdealDiffuseBxDF>::
                                 Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                 ::reg);
          }
          *(long *)(in_FS_OFFSET + -0x5c8) = *(long *)(in_FS_OFFSET + -0x5c8) + 1;
          auVar4._8_4_ = 0x7fffffff;
          auVar4._0_8_ = 0x7fffffff7fffffff;
          auVar4._12_4_ = 0x7fffffff;
          auVar24 = vandps_avx512vl(local_108,auVar4);
          fVar26 = -(float)local_d8._0_4_ / (1.0 / auVar24._0_4_);
          uVar6 = vcmpss_avx512f(ZEXT816(0) << 0x20,local_108,1);
          bVar7 = (bool)((byte)uVar6 & 1);
          fVar26 = (float)local_e8._0_4_ +
                   (float)((uint)bVar7 * (int)fVar26 + (uint)!bVar7 * (int)-fVar26);
          if ((fVar26 == (float)local_e8._0_4_) && (!NAN(fVar26) && !NAN((float)local_e8._0_4_))) {
            *(long *)(in_FS_OFFSET + -0x5d0) = *(long *)(in_FS_OFFSET + -0x5d0) + 1;
            break;
          }
          uVar22 = uVar22 * 0x5851f42d4c957f2d + lVar1;
          if ((fVar26 <= 0.0) || (this->thickness <= fVar26)) {
            local_d8 = ZEXT816(0) << 0x40;
            if (0.0 <= fVar26) {
              local_d8 = vminss_avx(ZEXT416((uint)this->thickness),ZEXT416((uint)fVar26));
              goto LAB_0037c241;
            }
            goto LAB_0037c249;
          }
          local_e8._0_4_ = fVar26;
          auVar27._0_8_ = local_88._0_8_ ^ 0x8000000080000000;
          auVar27._8_4_ = local_88._8_4_ ^ 0x80000000;
          auVar27._12_4_ = local_88._12_4_ ^ 0x80000000;
          local_78.f.values.values[2] = -(float)local_108._0_4_;
          local_78.f.values.values._0_8_ = vmovlps_avx(auVar27);
          uVar20 = uVar22 * 0x5851f42d4c957f2d + lVar1;
          auVar28._8_8_ = 0;
          auVar28._0_8_ = uVar22;
          auVar35._8_8_ = 0;
          auVar35._0_8_ = uVar20;
          auVar24 = vpunpcklqdq_avx(auVar28,auVar35);
          auVar31 = vpsrlvq_avx2(auVar24,_DAT_006015a0);
          auVar4 = vpsrlvq_avx2(auVar24,_DAT_006015b0);
          auVar24 = vpsrlq_avx(auVar24,0x3b);
          auVar24 = vpshufd_avx(auVar24,0xe8);
          auVar31 = vpshufd_avx(auVar31 ^ auVar4,0xe8);
          auVar40 = ZEXT1260(auVar31._4_12_);
          auVar24 = vprorvd_avx512vl(auVar31,auVar24);
          auVar24 = vcvtudq2ps_avx512vl(auVar24);
          auVar5._8_4_ = 0x2f800000;
          auVar5._0_8_ = 0x2f8000002f800000;
          auVar5._12_4_ = 0x2f800000;
          auVar24 = vmulps_avx512vl(auVar24,auVar5);
          auVar8._8_4_ = 0x3f7fffff;
          auVar8._0_8_ = 0x3f7fffff3f7fffff;
          auVar8._12_4_ = 0x3f7fffff;
          auVar24 = vminps_avx512vl(auVar24,auVar8);
          local_f8 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar24);
          auVar34 = (undefined1  [56])0x0;
          VVar42 = SampleHenyeyGreenstein
                             ((Vector3f *)&local_78,local_f0,(Point2f *)&local_f8,&local_ec);
          auVar39._0_4_ = VVar42.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar39._4_60_ = auVar40;
          auVar41._0_8_ = VVar42.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar41._8_56_ = auVar34;
          if ((local_ec <= 0.0) || ((auVar39._0_4_ == 0.0 && (!NAN(auVar39._0_4_))))) break;
          local_108 = auVar39._0_16_;
          local_128[0] = local_ec * (this->albedo).values.values[0] * local_128[0];
          local_b8.pdf = local_10c * local_ec;
          local_128[1] = local_ec * (this->albedo).values.values[1] * local_128[1];
          local_128[2] = local_ec * (this->albedo).values.values[2] * local_128[2];
          local_128[3] = local_ec * (this->albedo).values.values[3] * local_128[3];
          auVar29 = auVar41._0_16_;
          auVar33 = ZEXT464((uint)local_e8._0_4_);
        }
        else {
          uVar20 = 0;
          do {
            uVar18 = uVar20;
            if (uVar18 == 3) goto LAB_0037c1bd;
            fVar25 = (this->albedo).values.values[uVar18 + 1];
          } while ((fVar25 == 0.0) && (uVar20 = uVar18 + 1, !NAN(fVar25)));
          if (uVar18 < 3) goto LAB_0037bfb2;
LAB_0037c1bd:
          FVar3 = this->thickness;
          local_d8 = ZEXT416((uint)FVar3);
          auVar12._8_4_ = 0x7fffffff;
          auVar12._0_8_ = 0x7fffffff7fffffff;
          auVar12._12_4_ = 0x7fffffff;
          auVar24 = vandps_avx512vl(ZEXT416((uint)FVar3),auVar12);
          if (1.1754944e-38 < auVar24._0_4_) {
            auVar13._8_4_ = 0x80000000;
            auVar13._0_8_ = 0x8000000080000000;
            auVar13._12_4_ = 0x80000000;
            auVar31 = vxorps_avx512vl(auVar24,auVar13);
            auVar36._8_4_ = 0x7fffffff;
            auVar36._0_8_ = 0x7fffffff7fffffff;
            auVar36._12_4_ = 0x7fffffff;
            auVar24 = vandps_avx(auVar36,local_108);
            local_d8 = ZEXT416((uint)FVar3);
            fVar26 = expf(auVar31._0_4_ / auVar24._0_4_);
          }
          uVar6 = vcmpss_avx512f(local_d8,ZEXT416((uint)local_e8._0_4_),0);
          local_d8._0_4_ = (uint)!(bool)((byte)uVar6 & 1) * local_d8._0_4_;
          local_128[0] = fVar26 * local_128[0];
          local_128[1] = fVar26 * local_128[1];
          local_128[2] = fVar26 * local_128[2];
          local_128[3] = fVar26 * local_128[3];
LAB_0037c241:
          if ((local_d8._0_4_ != 0.0) || (NAN(local_d8._0_4_))) {
            this_00 = (IdealDiffuseBxDF *)0x0;
            this_01 = this;
          }
          else {
LAB_0037c249:
            this_00 = local_c0;
            this_01 = (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)0x0;
          }
          uVar15 = (uint)(uVar22 >> 0x2d) ^ (uint)(uVar22 >> 0x1b);
          bVar19 = (byte)(uVar22 >> 0x3b);
          auVar24 = vcvtusi2ss_avx512f(in_XMM6,uVar15 >> bVar19 | uVar15 << 0x20 - bVar19);
          uVar22 = uVar22 * 0x5851f42d4c957f2d + lVar1;
          auVar24 = vminss_avx(ZEXT416((uint)(auVar24._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
          uVar20 = uVar22 * 0x5851f42d4c957f2d + lVar1;
          auVar30._8_8_ = 0;
          auVar30._0_8_ = uVar22;
          auVar37._8_8_ = 0;
          auVar37._0_8_ = uVar20;
          auVar31 = vpunpcklqdq_avx(auVar30,auVar37);
          auVar4 = vpsrlvq_avx2(auVar31,_DAT_006015a0);
          auVar5 = vpsrlvq_avx2(auVar31,_DAT_006015b0);
          auVar31 = vpsrlq_avx(auVar31,0x3b);
          auVar31 = vpshufd_avx(auVar31,0xe8);
          auVar4 = vpshufd_avx(auVar4 ^ auVar5,0xe8);
          auVar31 = vprorvd_avx512vl(auVar4,auVar31);
          auVar31 = vcvtudq2ps_avx512vl(auVar31);
          auVar9._8_4_ = 0x2f800000;
          auVar9._0_8_ = 0x2f8000002f800000;
          auVar9._12_4_ = 0x2f800000;
          auVar31 = vmulps_avx512vl(auVar31,auVar9);
          auVar10._8_4_ = 0x3f7fffff;
          auVar10._0_8_ = 0x3f7fffff3f7fffff;
          auVar10._12_4_ = 0x3f7fffff;
          auVar31 = vminps_avx512vl(auVar31,auVar10);
          local_f8 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar31);
          wo_01.super_Tuple3<pbrt::Vector3,_float>._0_8_ = local_88._0_8_ ^ 0x8000000080000000;
          wo_01.super_Tuple3<pbrt::Vector3,_float>.z = -(float)local_108._0_4_;
          if (this_01 == (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)0x0)
          {
            wo_02.super_Tuple3<pbrt::Vector3,_float>.z = wo_01.super_Tuple3<pbrt::Vector3,_float>.z;
            wo_02.super_Tuple3<pbrt::Vector3,_float>.x =
                 (float)(int)wo_01.super_Tuple3<pbrt::Vector3,_float>._0_8_;
            wo_02.super_Tuple3<pbrt::Vector3,_float>.y =
                 (float)(int)(wo_01.super_Tuple3<pbrt::Vector3,_float>._0_8_ >> 0x20);
            IdealDiffuseBxDF::Sample_f
                      (&local_78,this_00,wo_02,auVar24._0_4_,(Point2f *)&local_f8,local_110,All);
          }
          else {
            DielectricInterfaceBxDF::Sample_f
                      (&local_78,&this_01->top,wo_01,auVar24._0_4_,(Point2f *)&local_f8,local_110,
                       All);
          }
          if (local_78.pdf <= 0.0) break;
          local_108 = ZEXT416((uint)local_78.wi.super_Tuple3<pbrt::Vector3,_float>.z);
          if ((local_78.wi.super_Tuple3<pbrt::Vector3,_float>.z == 0.0) &&
             (!NAN(local_78.wi.super_Tuple3<pbrt::Vector3,_float>.z))) break;
          local_b8.pdf = local_10c * local_78.pdf;
          auVar29._8_8_ = 0;
          auVar29._0_4_ = local_78.wi.super_Tuple3<pbrt::Vector3,_float>.x;
          auVar29._4_4_ = local_78.wi.super_Tuple3<pbrt::Vector3,_float>.y;
          if (((undefined1)local_78.flags & Transmission) != Unset) {
            if (bVar14 && bVar23) {
              auVar29._0_8_ =
                   local_78.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
              auVar29._8_4_ = 0x80000000;
              auVar29._12_4_ = 0x80000000;
            }
            *(ulong *)(__return_storage_ptr__->f).values.values =
                 CONCAT44(local_78.f.values.values[1] * local_128[1],
                          local_78.f.values.values[0] * local_128[0]);
            *(ulong *)((__return_storage_ptr__->f).values.values + 2) =
                 CONCAT44(local_78.f.values.values[3] * local_128[3],
                          local_78.f.values.values[2] * local_128[2]);
            uVar6 = vmovlps_avx(auVar29);
            (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar6;
            (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.y =
                 (float)(int)((ulong)uVar6 >> 0x20);
            (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.z =
                 (float)((uint)(bVar14 && bVar23) *
                         (int)-local_78.wi.super_Tuple3<pbrt::Vector3,_float>.z +
                        (uint)(!bVar14 || !bVar23) *
                        (int)local_78.wi.super_Tuple3<pbrt::Vector3,_float>.z);
            __return_storage_ptr__->pdf = local_b8.pdf;
            __return_storage_ptr__->flags =
                 ((float)local_48._0_4_ * local_78.wi.super_Tuple3<pbrt::Vector3,_float>.z <= 0.0) +
                 GlossyReflection;
            return __return_storage_ptr__;
          }
          auVar32._4_4_ = local_78.wi.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar32._0_4_ = local_78.wi.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar32._8_4_ = local_78.wi.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar32._12_4_ = local_78.wi.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar11._8_4_ = 0x7fffffff;
          auVar11._0_8_ = 0x7fffffff7fffffff;
          auVar11._12_4_ = 0x7fffffff;
          auVar24 = vandps_avx512vl(auVar32,auVar11);
          local_128[0] = auVar24._0_4_ * local_78.f.values.values[0] * local_128[0];
          local_128[1] = auVar24._4_4_ * local_78.f.values.values[1] * local_128[1];
          local_128[2] = auVar24._8_4_ * local_78.f.values.values[2] * local_128[2];
          local_128[3] = auVar24._12_4_ * local_78.f.values.values[3] * local_128[3];
          auVar33 = ZEXT1664(local_d8);
        }
        auVar38 = ZEXT1664(auVar29);
        uVar21 = uVar21 + 1;
        auVar41 = ZEXT1664(ZEXT816(0) << 0x40);
      } while (uVar21 < (this->config).maxDepth);
    }
  }
  (__return_storage_ptr__->f).values.values[0] = 0.0;
  (__return_storage_ptr__->f).values.values[1] = 0.0;
  (__return_storage_ptr__->f).values.values[2] = 0.0;
  (__return_storage_ptr__->f).values.values[3] = 0.0;
  (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  *(undefined8 *)&(__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.z = 0;
  __return_storage_ptr__->flags = Unset;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    BSDFSample Sample_f(Vector3f wo, Float uc, const Point2f &u, TransportMode mode,
                        BxDFReflTransFlags sampleFlags = BxDFReflTransFlags::All) const {
        CHECK(sampleFlags == BxDFReflTransFlags::All);  // for now
        // Set _wo_ for layered BSDF sampling
        bool flipWi = false;
        if (config.twoSided && wo.z < 0) {
            wo = -wo;
            flipWi = true;
        }

        // Sample BSDF at entrance interface to get initial direction _w_
        bool enteredTop = wo.z > 0;
        BSDFSample bs =
            enteredTop ? top.Sample_f(wo, uc, u, mode) : bottom.Sample_f(wo, uc, u, mode);
        if (!bs)
            return {};
        if (bs.IsReflection()) {
            if (flipWi)
                bs.wi = -bs.wi;
            return bs;
        }
        Vector3f w = bs.wi;

        // Declare _RNG_ for layered BSDF sampling
        RNG rng(Hash(GetOptions().seed, wo), Hash(uc, u));
        auto r = [&rng]() {
            return std::min<Float>(rng.Uniform<Float>(), OneMinusEpsilon);
        };

        // Declare common variables for layered BSDF sampling
        SampledSpectrum f = bs.f * AbsCosTheta(bs.wi);
        Float pdf = bs.pdf;
        Float z = enteredTop ? thickness : 0;
        HGPhaseFunction phase(g);

        for (int depth = 0; depth < config.maxDepth; ++depth) {
            // Follow random walk through layeres to sample layered BSDF
            // Possibly terminate layered BSDF sampling with Russian Roulette
            Float rrBeta = f.MaxComponentValue() / pdf;
            if (depth > 3 && rrBeta < 0.25) {
                Float q = std::max<Float>(0, 1 - rrBeta);
                if (r() < q)
                    return {};
                pdf *= 1 - q;
            }
            if (w.z == 0)
                return {};

            if (albedo) {
                // Sample potential scattering event in layered medium
                Float sigma_t = 1;
                Float dz = SampleExponential(r(), sigma_t / AbsCosTheta(w));
                Float zp = w.z > 0 ? (z + dz) : (z - dz);
                CHECK_RARE(1e-5, zp == z);
                if (zp == z)
                    return {};
                if (0 < zp && zp < thickness) {
                    // Update path state for valid scattering event between interfaces
#if 0
// TODO: cancel out and simplify: should be
// f *= AbsCosTheta(w) / sigma_t (!!!) -- that in turn makes the tricky cosine stuff
// more reasonable / palatible...
//f *= Tr(dz, w) / ExponentialPDF(dz, sigma_t / AbsCosTheta(w));
f *= AbsCosTheta(w) / sigma_t;
// Tricky cosines. Always divide here since we always
// include it when we leave a surface.
f /= AbsCosTheta(w);
#endif
                    PhaseFunctionSample ps = phase.Sample_p(-w, Point2f(r(), r()));
                    if (!ps || ps.wi.z == 0)
                        return {};
                    f *= albedo * ps.p;
                    pdf *= ps.pdf;
                    w = ps.wi;
                    z = zp;

                    continue;
                }
                z = Clamp(zp, 0, thickness);
                if (z == 0)
                    DCHECK_LT(w.z, 0);
                else
                    DCHECK_GT(w.z, 0);

            } else {
                // Advance to the other layer interface
                // Bounce back and forth between the top and bottom
                z = (z == thickness) ? 0 : thickness;
                f *= Tr(thickness, w);
            }
            // Initialize _interface_ for current interface surface
            TopOrBottomBxDF<TopBxDF, BottomBxDF> interface;
            if (z == 0)
                interface = &bottom;
            else
                interface = &top;

            // Sample interface BSDF to determine new path direction
            Float uc = r();
            Point2f u(r(), r());
            BSDFSample bs = interface.Sample_f(-w, uc, u, mode);
            if (!bs || bs.wi.z == 0)
                return {};
            f *= bs.f;
            pdf *= bs.pdf;
            w = bs.wi;

            // Return _BSDFSample_ if path has left the layers
            if (bs.IsTransmission()) {
                BxDFFlags flags = SameHemisphere(wo, w) ? BxDFFlags::GlossyReflection
                                                        : BxDFFlags::GlossyTransmission;
                if (flipWi)
                    w = -w;
                return BSDFSample(f, w, pdf, flags);
            }

            // Scale _f_ by cosine term after scattering at the interface
            f *= AbsCosTheta(bs.wi);
        }
        return {};
    }